

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

size_t xemmai::t_type_of<xemmai::t_object>::f_do_call(t_object *a_this,t_pvalue *a_stack,size_t a_n)

{
  t_type *ptVar1;
  size_t sVar2;
  t_object *ptVar3;
  
  ptVar1 = a_this->v_type;
  sVar2 = ptVar1->v_instance_fields;
  ptVar3 = *(t_object **)((long)&ptVar1[1].v_super + sVar2 * 0x18 + 8);
  if ((ptVar3 < (t_object *)0x5) || (ptVar3->v_type->v_bindable != true)) {
    (a_stack->super_t_pointer).v_p = *(t_object **)((long)&ptVar1[1].v_super + sVar2 * 0x18 + 8);
    a_stack->field_0 =
         *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
          (&ptVar1[1].v_module + sVar2 * 3);
    a_this = (t_object *)0x0;
  }
  else {
    (a_stack->super_t_pointer).v_p = ptVar3;
  }
  a_stack[1].super_t_pointer.v_p = a_this;
  return a_n;
}

Assistant:

size_t t_type::f_do_call(t_object* a_this, t_pvalue* a_stack, size_t a_n)
{
	auto type = a_this->f_type();
	type->f_bind_class(a_this, type->v_instance_fields + 1, a_stack);
	return a_n;
}